

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

void __thiscall sf::Texture::setSmooth(Texture *this,bool smooth)

{
  char *expression;
  uint line;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_d;
  TextureSaver local_c;
  
  if ((this->m_isSmooth != smooth) && (this->m_isSmooth = smooth, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_d);
    priv::TextureSaver::TextureSaver(&local_c);
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                       ,0x263,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    glTexParameteri(0xde1,0x2800,this->m_isSmooth | 0x2600);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                       ,0x264,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                      );
    if (this->m_hasMipmap == true) {
      glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2702);
      expression = 
      "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR)"
      ;
      line = 0x268;
    }
    else {
      glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
      expression = 
      "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)";
      line = 0x26c;
    }
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                       ,line,expression);
    priv::TextureSaver::~TextureSaver(&local_c);
    GlResource::TransientContextLock::~TransientContextLock(&local_d);
  }
  return;
}

Assistant:

void Texture::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

            if (m_hasMipmap)
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));
            }
            else
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            }
        }
    }
}